

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall
fasttext::Args::parseArgs
          (Args *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  code *__nptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  logic_error *plVar8;
  int *piVar9;
  ulong uVar10;
  pointer pbVar11;
  Args *this_00;
  ulong uVar12;
  char *__nptr_00;
  float fVar13;
  undefined1 auVar14 [12];
  out_of_range anon_var_0;
  string command;
  code *local_98 [2];
  undefined1 local_88 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  Args *local_70;
  Args *local_68;
  Args *local_60;
  Args *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_50[0] = local_40;
  pcVar1 = pbVar11[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + pbVar11[1]._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_50);
  if (iVar3 == 0) {
    this->loss = softmax;
    this->model = sup;
    this->minCount = 1;
    this->minn = 0;
    this->maxn = 0;
    this->lr = 0.1;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
      this->model = cbow;
    }
  }
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x41) {
LAB_0011646b:
    if (((this->input)._M_string_length != 0) && ((this->output)._M_string_length != 0)) {
      if ((this->wordNgrams < 2) && (this->maxn == 0)) {
        this->bucket = 0;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return;
    }
LAB_00116561:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Empty input or output path.",0x1b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
LAB_001167c1:
    exit(1);
  }
  iVar3 = 2;
  uVar12 = 2;
  local_70 = (Args *)&this->pretrainedVectors;
  local_68 = (Args *)&this->label;
  local_60 = (Args *)&this->output;
  local_58 = (Args *)&this->weights;
  local_78 = args;
LAB_0011579c:
  if (*pbVar11[uVar12]._M_dataplus._M_p != '-') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Provided argument without a dash! Usage:",0x28);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
    goto LAB_001167c1;
  }
  iVar4 = std::__cxx11::string::compare((char *)(pbVar11 + uVar12));
  if (iVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Here is the help! Usage:",0x18);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
    goto LAB_001167c1;
  }
  iVar4 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12));
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12));
    if (iVar4 == 0) {
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ulong)(iVar3 + 1);
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <= uVar12)
      goto LAB_00116539;
      pcVar1 = pbVar11[uVar12]._M_dataplus._M_p;
      local_98[0] = (code *)local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + pbVar11[uVar12]._M_string_length);
      this_00 = local_58;
      goto LAB_00115ba5;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12));
    if (iVar4 == 0) {
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ulong)(iVar3 + 1);
      if (uVar12 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5))
      {
        pcVar1 = pbVar11[uVar12]._M_dataplus._M_p;
        local_98[0] = (code *)local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,pcVar1,pcVar1 + pbVar11[uVar12]._M_string_length);
        this_00 = local_60;
        goto LAB_00115ba5;
      }
      goto LAB_00116547;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12));
    if (iVar4 == 0) {
      piVar9 = (int *)(long)(iVar3 + 1);
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (piVar9 < (int *)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5))
      {
        __nptr = (code *)pbVar11[(long)piVar9]._M_dataplus._M_p;
        piVar9 = __errno_location();
        iVar4 = *piVar9;
        *piVar9 = 0;
        fVar13 = strtof((char *)__nptr,(char **)local_98);
        if (local_98[0] != __nptr) {
          __nptr_00 = "-h";
          if (*piVar9 == 0) {
            *piVar9 = iVar4;
          }
          else if (*piVar9 == 0x22) goto LAB_001165ac;
          this->lr = (double)fVar13;
          goto LAB_00115fd0;
        }
        goto LAB_00116555;
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar4 == 0) {
          piVar9 = (int *)(long)(iVar3 + 1);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (piVar9 < (int *)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >>
                              5)) {
            __nptr_00 = pbVar11[(long)piVar9]._M_dataplus._M_p;
            piVar9 = __errno_location();
            iVar4 = *piVar9;
            *piVar9 = 0;
            lVar5 = strtol(__nptr_00,(char **)local_98,10);
            if (local_98[0] != (code *)__nptr_00) {
              __nptr_00 = "-h";
              if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar9 != 0x22)) {
                if (*piVar9 == 0) {
                  *piVar9 = iVar4;
                }
                this->dim = (int)lVar5;
                goto LAB_00115fd0;
              }
              goto LAB_001165b8;
            }
            goto LAB_001165c4;
          }
          goto LAB_0011668c;
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar4 == 0) {
          piVar9 = (int *)(long)(iVar3 + 1);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
              piVar9) goto LAB_0011668c;
          __nptr_00 = pbVar11[(long)piVar9]._M_dataplus._M_p;
          piVar9 = __errno_location();
          iVar4 = *piVar9;
          *piVar9 = 0;
          lVar5 = strtol(__nptr_00,(char **)local_98,10);
          if (local_98[0] != (code *)__nptr_00) {
            __nptr_00 = "-h";
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = iVar4;
              }
              this->ws = (int)lVar5;
              goto LAB_00115fd0;
            }
            goto LAB_001165d0;
          }
          goto LAB_001165dc;
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar4 == 0) {
          piVar9 = (int *)(long)(iVar3 + 1);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
              piVar9) goto LAB_0011668c;
          __nptr_00 = pbVar11[(long)piVar9]._M_dataplus._M_p;
          piVar9 = __errno_location();
          iVar4 = *piVar9;
          *piVar9 = 0;
          lVar5 = strtol(__nptr_00,(char **)local_98,10);
          if (local_98[0] != (code *)__nptr_00) {
            __nptr_00 = "-h";
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = iVar4;
              }
              this->epoch = (int)lVar5;
              goto LAB_00115fd0;
            }
            goto LAB_001165e8;
          }
          goto LAB_001165f4;
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar4 == 0) {
          piVar9 = (int *)(long)(iVar3 + 1);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
              piVar9) goto LAB_0011668c;
          __nptr_00 = pbVar11[(long)piVar9]._M_dataplus._M_p;
          piVar9 = __errno_location();
          iVar4 = *piVar9;
          *piVar9 = 0;
          lVar5 = strtol(__nptr_00,(char **)local_98,10);
          if (local_98[0] != (code *)__nptr_00) {
            __nptr_00 = "-h";
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = iVar4;
              }
              this->minCount = (int)lVar5;
              goto LAB_00115fd0;
            }
            goto LAB_00116600;
          }
          goto LAB_0011660c;
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar4 == 0) {
          piVar9 = (int *)(long)(iVar3 + 1);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
              piVar9) goto LAB_0011668c;
          __nptr_00 = pbVar11[(long)piVar9]._M_dataplus._M_p;
          piVar9 = __errno_location();
          iVar4 = *piVar9;
          *piVar9 = 0;
          lVar5 = strtol(__nptr_00,(char **)local_98,10);
          if (local_98[0] != (code *)__nptr_00) {
            __nptr_00 = "-h";
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = iVar4;
              }
              this->minCountLabel = (int)lVar5;
              goto LAB_00115fd0;
            }
            goto LAB_00116618;
          }
          goto LAB_00116624;
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
            this->wordNgrams = iVar4;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            __nptr_00 = (char *)((long)piVar9 * 0x20);
            iVar4 = std::__cxx11::string::compare((char *)((code *)__nptr_00 + (long)pbVar11));
            if (iVar4 == 0) {
              this->loss = hs;
            }
            else {
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                  piVar9) goto LAB_0011668c;
              iVar4 = std::__cxx11::string::compare((char *)((code *)__nptr_00 + (long)pbVar11));
              if (iVar4 == 0) {
                this->loss = ns;
              }
              else {
                pbVar11 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if ((int *)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5)
                    <= piVar9) goto LAB_0011668c;
                iVar4 = std::__cxx11::string::compare((char *)((code *)__nptr_00 + (long)pbVar11));
                if (iVar4 == 0) {
                  this->loss = softmax;
                }
                else {
                  pbVar11 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  if ((int *)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                             ) <= piVar9) goto LAB_0011668c;
                  iVar4 = std::__cxx11::string::compare((char *)((code *)__nptr_00 + (long)pbVar11))
                  ;
                  if (iVar4 != 0) {
                    pbVar11 = (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    if ((int *)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >>
                               5) <= piVar9) goto LAB_0011668c;
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)((code *)__nptr_00 + (long)pbVar11));
                    if (iVar4 != 0) goto LAB_00116630;
                  }
                  this->loss = ova;
                }
              }
            }
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
            this->bucket = iVar4;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
            this->minn = iVar4;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
            this->maxn = iVar4;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
            this->thread = iVar4;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            fVar13 = std::__cxx11::stof(pbVar11 + (long)piVar9,(size_t *)0x0);
            this->t = (double)fVar13;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar10 = (ulong)(iVar3 + 1);
            if (uVar10 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11
                                >> 5)) {
              pcVar1 = pbVar11[uVar10]._M_dataplus._M_p;
              local_98[0] = (code *)local_88;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_98,pcVar1,pcVar1 + pbVar11[uVar10]._M_string_length);
              this_00 = local_68;
              goto LAB_00115ba5;
            }
            goto LAB_0011669d;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)(long)(iVar3 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                piVar9) goto LAB_0011668c;
            iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
            this->verbose = iVar4;
            goto LAB_00115fd0;
          }
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            if (iVar4 == 0) {
              iVar3 = iVar3 + -1;
              this->saveOutput = true;
              goto LAB_00115fd0;
            }
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            if (iVar4 == 0) {
              iVar3 = iVar3 + -1;
              this->qnorm = true;
              goto LAB_00115fd0;
            }
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            if (iVar4 == 0) {
              iVar3 = iVar3 + -1;
              this->retrain = true;
              goto LAB_00115fd0;
            }
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            if (iVar4 == 0) {
              iVar3 = iVar3 + -1;
              this->qout = true;
              goto LAB_00115fd0;
            }
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            pvVar2 = local_78;
            if (iVar4 == 0) {
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              piVar9 = (int *)(long)(iVar3 + 1);
              if ((int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                  piVar9) goto LAB_0011668c;
              iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
              this->cutoff = (long)iVar4;
              args = pvVar2;
              goto LAB_00115fd0;
            }
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            if (iVar4 == 0) {
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              piVar9 = (int *)(long)(iVar3 + 1);
              if ((int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                  piVar9) goto LAB_0011668c;
              iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
              this->dsub = (long)iVar4;
              goto LAB_00115fd0;
            }
            goto LAB_001166ab;
          }
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = (ulong)(iVar3 + 1);
          if (uVar10 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >>
                              5)) {
            pcVar1 = pbVar11[uVar10]._M_dataplus._M_p;
            local_98[0] = (code *)local_88;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_98,pcVar1,pcVar1 + pbVar11[uVar10]._M_string_length);
            this_00 = local_70;
            goto LAB_00115ba5;
          }
          auVar14 = std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
          uVar7 = auVar14._0_8_;
          if (auVar14._8_4_ != 1) {
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            _Unwind_Resume(uVar7);
          }
          plVar8 = (logic_error *)__cxa_get_exception_ptr(uVar7);
          std::logic_error::logic_error((logic_error *)local_98,plVar8);
          local_98[0] = operator_delete;
          __cxa_begin_catch(uVar7);
          pbVar11 = (local_78->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,pbVar11[uVar12]._M_dataplus._M_p,
                              pbVar11[uVar12]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," is missing an argument",0x17);
          std::endl<char,std::char_traits<char>>(poVar6);
          printHelp(this);
          goto LAB_001167c1;
        }
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        piVar9 = (int *)(long)(iVar3 + 1);
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
            piVar9) goto LAB_0011668c;
        iVar4 = std::__cxx11::stoi(pbVar11 + (long)piVar9,(size_t *)0x0,10);
        this->neg = iVar4;
        goto LAB_00115fd0;
      }
      piVar9 = (int *)(long)(iVar3 + 1);
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (piVar9 < (int *)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5))
      {
        __nptr_00 = pbVar11[(long)piVar9]._M_dataplus._M_p;
        piVar9 = __errno_location();
        iVar4 = *piVar9;
        *piVar9 = 0;
        lVar5 = strtol(__nptr_00,(char **)local_98,10);
        if (local_98[0] != (code *)__nptr_00) {
          __nptr_00 = "-h";
          if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar9 != 0x22)) {
            if (*piVar9 == 0) {
              *piVar9 = iVar4;
            }
            this->lrUpdateRate = (int)lVar5;
            goto LAB_00115fd0;
          }
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
LAB_001165ac:
        std::__throw_out_of_range("stof");
LAB_001165b8:
        std::__throw_out_of_range("stoi");
LAB_001165c4:
        std::__throw_invalid_argument("stoi");
LAB_001165d0:
        std::__throw_out_of_range("stoi");
LAB_001165dc:
        std::__throw_invalid_argument("stoi");
LAB_001165e8:
        std::__throw_out_of_range("stoi");
LAB_001165f4:
        std::__throw_invalid_argument("stoi");
LAB_00116600:
        std::__throw_out_of_range("stoi");
LAB_0011660c:
        std::__throw_invalid_argument("stoi");
LAB_00116618:
        std::__throw_out_of_range("stoi");
LAB_00116624:
        std::__throw_invalid_argument("stoi");
LAB_00116630:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown loss: ",0xe);
        pbVar11 = (local_78->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(local_78->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
            piVar9) goto LAB_0011668c;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,*(char **)((code *)__nptr_00 + (long)pbVar11),
                            *(long *)((code *)__nptr_00 + (long)&pbVar11->_M_string_length));
        std::endl<char,std::char_traits<char>>(poVar6);
        printHelp(this);
        goto LAB_001167c1;
      }
    }
LAB_0011668c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",piVar9);
LAB_0011669d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001166ab:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unknown argument: ",0x12);
    pbVar11 = (local_78->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,pbVar11[uVar12]._M_dataplus._M_p,
                        pbVar11[uVar12]._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar6);
    printHelp(this);
    goto LAB_001167c1;
  }
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)(iVar3 + 1);
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <= uVar12) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00116539:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00116547:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00116555:
    std::__throw_invalid_argument("stof");
    goto LAB_00116561;
  }
  pcVar1 = pbVar11[uVar12]._M_dataplus._M_p;
  local_98[0] = (code *)local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar1,pcVar1 + pbVar11[uVar12]._M_string_length);
  this_00 = this;
LAB_00115ba5:
  std::__cxx11::string::operator=((string *)this_00,(string *)local_98);
  args = local_78;
  if (local_98[0] != (code *)local_88) {
    operator_delete(local_98[0]);
    args = local_78;
  }
LAB_00115fd0:
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = iVar3 + 2;
  uVar12 = (ulong)iVar3;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <= uVar12)
  goto LAB_0011646b;
  goto LAB_0011579c;
}

Assistant:

void Args::parseArgs(const std::vector<std::string>& args) {
  std::string command(args[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    minn = 0;
    maxn = 0;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  for (int ai = 2; ai < args.size(); ai += 2) {
    if (args[ai][0] != '-') {
      std::cerr << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    try {
      if (args[ai] == "-h") {
        std::cerr << "Here is the help! Usage:" << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      } else if (args[ai] == "-input") {
        input = std::string(args.at(ai + 1));
      } else if (args[ai] == "-weights") {
        weights = std::string(args.at(ai + 1));
      } else if (args[ai] == "-output") {
        output = std::string(args.at(ai + 1));
      } else if (args[ai] == "-lr") {
        lr = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-lrUpdateRate") {
        lrUpdateRate = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dim") {
        dim = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-ws") {
        ws = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-epoch") {
        epoch = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCount") {
        minCount = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCountLabel") {
        minCountLabel = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-neg") {
        neg = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-wordNgrams") {
        wordNgrams = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-loss") {
        if (args.at(ai + 1) == "hs") {
          loss = loss_name::hs;
        } else if (args.at(ai + 1) == "ns") {
          loss = loss_name::ns;
        } else if (args.at(ai + 1) == "softmax") {
          loss = loss_name::softmax;
        } else if (
            args.at(ai + 1) == "one-vs-all" || args.at(ai + 1) == "ova") {
          loss = loss_name::ova;
        } else {
          std::cerr << "Unknown loss: " << args.at(ai + 1) << std::endl;
          printHelp();
          exit(EXIT_FAILURE);
        }
      } else if (args[ai] == "-bucket") {
        bucket = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minn") {
        minn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-maxn") {
        maxn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-thread") {
        thread = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-t") {
        t = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-label") {
        label = std::string(args.at(ai + 1));
      } else if (args[ai] == "-verbose") {
        verbose = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-pretrainedVectors") {
        pretrainedVectors = std::string(args.at(ai + 1));
      } else if (args[ai] == "-saveOutput") {
        saveOutput = true;
        ai--;
      } else if (args[ai] == "-qnorm") {
        qnorm = true;
        ai--;
      } else if (args[ai] == "-retrain") {
        retrain = true;
        ai--;
      } else if (args[ai] == "-qout") {
        qout = true;
        ai--;
      } else if (args[ai] == "-cutoff") {
        cutoff = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dsub") {
        dsub = std::stoi(args.at(ai + 1));
      } else {
        std::cerr << "Unknown argument: " << args[ai] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } catch (std::out_of_range) {
      std::cerr << args[ai] << " is missing an argument" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
  }
  if (input.empty() || output.empty()) {
    std::cerr << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
  if (wordNgrams <= 1 && maxn == 0) {
    bucket = 0;
  }
}